

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManPrintStatsClasses(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  iVar1 = p->nObjs;
  uVar4 = 0;
  uVar5 = 0;
  iVar6 = 0;
  for (lVar7 = 1; lVar7 < iVar1; lVar7 = lVar7 + 1) {
    iVar2 = Gia_ObjIsHead(p,(int)lVar7);
    if (iVar2 == 0) {
      if (((uint)p->pReprs[lVar7] & 0xfffffff) == 0) {
        uVar5 = uVar5 + 1;
      }
      else {
        iVar2 = Gia_ObjIsNone(p,(int)lVar7);
        iVar6 = iVar6 + iVar2;
      }
    }
    else {
      uVar4 = uVar4 + 1;
    }
  }
  iVar1 = p->vCos->nSize;
  iVar2 = p->vCis->nSize;
  iVar3 = Gia_ManAndNum(p);
  Abc_Print(1,"cst =%3d  cls =%6d  lit =%8d\n",(ulong)uVar5,(ulong)uVar4,
            (ulong)((iVar1 - (iVar6 + uVar4)) + iVar2 + iVar3));
  return;
}

Assistant:

void Gia_ManPrintStatsClasses( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0, Proved = 0, nLits;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
        if ( Gia_ObjProved(p, i) )
            Proved++;
    }
    CounterX -= Gia_ManCoNum(p);
    nLits = Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;

//    Abc_Print( 1, "i/o/ff =%5d/%5d/%5d  ", Gia_ManPiNum(p), Gia_ManPoNum(p), Gia_ManRegNum(p) );
//    Abc_Print( 1, "and =%5d  ", Gia_ManAndNum(p) );
//    Abc_Print( 1, "lev =%3d  ", Gia_ManLevelNum(p) );
    Abc_Print( 1, "cst =%3d  cls =%6d  lit =%8d\n", Counter0, Counter, nLits );
}